

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O3

lys_node * resolve_choice_dflt(lys_node_choice *choic,char *dflt)

{
  lys_node_choice *choic_00;
  lys_node *plVar1;
  
  choic_00 = (lys_node_choice *)choic->child;
  do {
    if (choic_00 == (lys_node_choice *)0x0) {
      return (lys_node *)0x0;
    }
    if (choic_00->nodetype == LYS_USES) {
      plVar1 = resolve_choice_dflt(choic_00,dflt);
      if (plVar1 != (lys_node *)0x0) {
        return plVar1;
      }
    }
    else if (((choic_00->nodetype & 0x807f) != LYS_UNKNOWN) && (choic_00->name == dflt)) {
      return (lys_node *)choic_00;
    }
    choic_00 = (lys_node_choice *)choic_00->next;
  } while( true );
}

Assistant:

static struct lys_node *
resolve_choice_dflt(struct lys_node_choice *choic, const char *dflt)
{
    struct lys_node *child, *ret;

    LY_TREE_FOR(choic->child, child) {
        if (child->nodetype == LYS_USES) {
            ret = resolve_choice_dflt((struct lys_node_choice *)child, dflt);
            if (ret) {
                return ret;
            }
        }

        if (ly_strequal(child->name, dflt, 1) && (child->nodetype & (LYS_ANYDATA | LYS_CASE
                | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_CHOICE))) {
            return child;
        }
    }

    return NULL;
}